

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_moves_8_ix(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
    return;
  }
  if (m68ki_cpu.s_flag != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    uVar2 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
    uVar4 = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
    if ((uVar2 >> 0xb & 1) == 0) {
      if ((short)uVar2 < 0) {
        my_fc_handler(m68ki_cpu.sfc);
        if (m68ki_cpu.pmmu_enabled != 0) {
          uVar4 = pmmu_translate_addr(uVar4);
        }
        uVar5 = m68k_read_memory_8(uVar4 & m68ki_cpu.address_mask);
        *(int *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x1c) + 0x20) = (int)(char)uVar5;
      }
      else {
        uVar5 = uVar2 >> 0xc & 7;
        uVar2 = m68ki_cpu.dar[uVar5];
        my_fc_handler(m68ki_cpu.sfc);
        if (m68ki_cpu.pmmu_enabled != 0) {
          uVar4 = pmmu_translate_addr(uVar4);
        }
        uVar3 = m68k_read_memory_8(uVar4 & m68ki_cpu.address_mask);
        m68ki_cpu.dar[uVar5] = uVar3 | uVar2 & 0xffffff00;
      }
      if (((ushort)m68ki_cpu.cpu_type & 0x18) != 0) {
        m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
      }
      return;
    }
    bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x3c));
    my_fc_handler(m68ki_cpu.dfc);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    m68k_write_memory_8(uVar4 & m68ki_cpu.address_mask,(uint)bVar1);
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_moves_8_ix(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();
			uint ea = EA_AY_IX_8();

			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			if(BIT_B(word2))		   /* Register to memory */
			{
				m68ki_write_8_fc(ea, REG_DFC, MASK_OUT_ABOVE_8(REG_DA[(word2 >> 12) & 15]));
				return;
			}
			if(BIT_F(word2))		   /* Memory to address register */
			{
				REG_A[(word2 >> 12) & 7] = MAKE_INT_8(m68ki_read_8_fc(ea, REG_SFC));
				if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
					USE_CYCLES(2);
				return;
			}
			/* Memory to data register */
			REG_D[(word2 >> 12) & 7] = MASK_OUT_BELOW_8(REG_D[(word2 >> 12) & 7]) | m68ki_read_8_fc(ea, REG_SFC);
			if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
				USE_CYCLES(2);
			return;
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}